

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::
_preBegin__profile_GLES__technique__pass__states__lighting_enable
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  xmlChar **ppxVar1;
  ParserChar *text;
  ParserChar *additionalText;
  bool bVar2;
  undefined8 in_RAX;
  undefined8 *puVar3;
  StringHash SVar4;
  bool failed;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  puVar3 = (undefined8 *)
           GeneratedSaxParser::StackMemoryManager::newObject
                     (&(this->
                       super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                       ).super_ParserTemplateBase.mStackMemoryManager,0x10);
  *puVar3 = 0;
  puVar3[1] = 0;
  *attributeDataPtr = puVar3;
  ppxVar1 = attributes->attributes;
  if (ppxVar1 != (xmlChar **)0x0) {
    text = *ppxVar1;
    while (text != (ParserChar *)0x0) {
      SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
      additionalText = ppxVar1[1];
      if (SVar4 == 0x76887d) {
        puVar3[1] = additionalText;
      }
      else {
        if (SVar4 == 0x7c83b5) {
          bVar2 = GeneratedSaxParser::Utils::toBool(additionalText,(bool *)((long)&uStack_38 + 7));
          *(bool *)puVar3 = bVar2;
          if (uStack_38._7_1_ != '\x01') goto LAB_007256e1;
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x85eef65,0x7c83b5,additionalText);
        }
        else {
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0x85eef65,text,additionalText);
        }
        if (bVar2 != false) {
          return false;
        }
      }
LAB_007256e1:
      text = ppxVar1[2];
      ppxVar1 = ppxVar1 + 2;
    }
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__profile_GLES__technique__pass__states__lighting_enable( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLES__technique__pass__states__lighting_enable( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLES__technique__pass__states__lighting_enable__AttributeData* attributeData = newData<profile_GLES__technique__pass__states__lighting_enable__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_VALUE:
    {
bool failed;
attributeData->value = GeneratedSaxParser::Utils::toBool(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIGHTING_ENABLE,
        HASH_ATTRIBUTE_VALUE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_PARAM:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_LIGHTING_ENABLE,
            HASH_ATTRIBUTE_PARAM,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_LIGHTING_ENABLE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}